

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

int __thiscall CVmObjTads::has_finalizer(CVmObjTads *this,vm_obj_id_t self)

{
  int iVar1;
  uint uVar2;
  vm_obj_id_t srcobj;
  vm_val_t val;
  undefined1 local_1c [4];
  uint local_18 [4];
  
  if (G_predef_X.obj_destruct == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    iVar1 = (*(this->super_CVmObject)._vptr_CVmObject[0xd])
                      (this,(ulong)G_predef_X.obj_destruct,local_18,self,local_1c,0);
    if ((iVar1 != 0) &&
       ((0x11 < local_18[0] || (uVar2 = 1, (0x24800U >> (local_18[0] & 0x1f) & 1) == 0)))) {
      uVar2 = (uint)(local_18[0] == 0x12);
    }
  }
  return uVar2;
}

Assistant:

int CVmObjTads::has_finalizer(VMG_ vm_obj_id_t self)
{
    vm_val_t val;
    vm_obj_id_t srcobj;

    /* 
     *   look up the finalization method - if it's defined, and it's a
     *   method, invoke it; otherwise do nothing 
     */
    return (G_predef->obj_destruct != VM_INVALID_PROP
            && get_prop(vmg_ G_predef->obj_destruct, &val, self, &srcobj, 0)
            && (val.typ == VM_CODEOFS
                || val.typ == VM_NATIVE_CODE
                || val.typ == VM_OBJX
                || val.typ == VM_BIFPTRX));
}